

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall
QToolBarAreaLayout::insertItem(QToolBarAreaLayout *this,DockPosition pos,QLayoutItem *item)

{
  bool bVar1;
  QToolBarAreaLayoutLine *pQVar2;
  QLayoutItem *in_RDX;
  long in_FS_OFFSET;
  rvalue_ref in_stack_ffffffffffffff78;
  rvalue_ref t;
  QToolBarAreaLayoutLine *in_stack_ffffffffffffff80;
  QToolBarAreaLayoutItem *this_00;
  QToolBarAreaLayoutItem local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<QToolBarAreaLayoutLine>::isEmpty((QList<QToolBarAreaLayoutLine> *)0x6f3998);
  if (bVar1) {
    QToolBarAreaLayoutLine::QToolBarAreaLayoutLine
              (in_stack_ffffffffffffff80,(Orientation)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QList<QToolBarAreaLayoutLine>::append
              ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
    ;
    QToolBarAreaLayoutLine::~QToolBarAreaLayoutLine((QToolBarAreaLayoutLine *)0x6f39ef);
  }
  pQVar2 = QList<QToolBarAreaLayoutLine>::last
                     ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff78);
  t = (rvalue_ref)&pQVar2->toolBarItems;
  this_00 = &local_20;
  QToolBarAreaLayoutItem::QToolBarAreaLayoutItem(this_00,in_RDX);
  QList<QToolBarAreaLayoutItem>::append((QList<QToolBarAreaLayoutItem> *)this_00,t);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarAreaLayout::insertItem(QInternal::DockPosition pos, QLayoutItem *item)
{
    if (docks[pos].lines.isEmpty())
        docks[pos].lines.append(QToolBarAreaLayoutLine(docks[pos].o));
    docks[pos].lines.last().toolBarItems.append(item);
}